

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnReturnCallIndirectExpr
          (BinaryReaderInterp *this,Index sig_index,Index table_index)

{
  string_view *psVar1;
  Result RVar2;
  Enum EVar3;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Location loc_2;
  Location loc_1;
  Location loc;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_78,sig_index,&loc_1);
  loc_2.field_1.field_0.last_column = 0;
  loc_2.filename._M_len = (this->filename_)._M_len;
  loc_2.filename._M_str = (this->filename_)._M_str;
  loc_2.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  Var::Var(&local_c0,table_index,&loc_2);
  RVar2 = SharedValidator::OnReturnCallIndirect(&this->validator_,&loc,&local_78,&local_c0);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    EVar3 = Error;
    RVar2 = GetReturnCallDropKeepCount
                      (this,(this->module_->func_types).
                            super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                            ._M_impl.super__Vector_impl_data._M_start + sig_index,1,&drop_count,
                       &keep_count);
    if (RVar2.enum_ != Error) {
      RVar2 = TypeChecker::GetCatchCount
                        (&(this->validator_).typechecker_,
                         (int)((ulong)((long)(this->label_stack_).
                                             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->label_stack_).
                                            super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                         &catch_drop_count);
      if (RVar2.enum_ != Error) {
        psVar1 = &this->filename_;
        loc.field_1.field_0.last_column = 0;
        loc.filename._M_len = psVar1->_M_len;
        loc.filename._M_str = (this->filename_)._M_str;
        loc_1.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
        loc_1.field_1.field_0.last_column = 0;
        loc_1.filename._M_len = psVar1->_M_len;
        loc_1.filename._M_str = (this->filename_)._M_str;
        loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
        Var::Var(&local_150,sig_index,&loc_1);
        loc_2.field_1.field_0.last_column = 0;
        loc_2.filename._M_len = psVar1->_M_len;
        loc_2.filename._M_str = (this->filename_)._M_str;
        loc_2.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
        Var::Var(&local_108,table_index,&loc_2);
        RVar2 = SharedValidator::OnReturnCallIndirect(&this->validator_,&loc,&local_150,&local_108);
        Var::~Var(&local_108);
        Var::~Var(&local_150);
        if (RVar2.enum_ != Error) {
          Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
          Istream::EmitCatchDrop(this->istream_,catch_drop_count);
          Istream::Emit(this->istream_,ReturnCallIndirect,table_index,sig_index);
          EVar3 = Ok;
        }
      }
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallIndirectExpr(Index sig_index,
                                                    Index table_index) {
  CHECK_RESULT(validator_.OnReturnCallIndirect(
      GetLocation(), Var(sig_index, GetLocation()),
      Var(table_index, GetLocation())));

  FuncType& func_type = module_.func_types[sig_index];

  Index drop_count, keep_count, catch_drop_count;
  // +1 to include the index of the function.
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, +1, &drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &catch_drop_count));
  // The validator must be run after we get the drop/keep counts, since it
  // changes the type stack.
  CHECK_RESULT(validator_.OnReturnCallIndirect(
      GetLocation(), Var(sig_index, GetLocation()),
      Var(table_index, GetLocation())));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.EmitCatchDrop(catch_drop_count);
  istream_.Emit(Opcode::ReturnCallIndirect, table_index, sig_index);
  return Result::Ok;
}